

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapecube.cpp
# Opt level: O0

void pzshape::TPZShapeCube::ShapeGenerating
               (TPZVec<double> *pt,TPZFMatrix<double> *phi,TPZFMatrix<double> *dphi)

{
  double dVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  double *pdVar5;
  int64_t iVar6;
  double dVar7;
  int mult;
  int dim;
  int hs;
  int nh;
  int h;
  TPZStack<int,_10> highsides;
  int is2_2;
  int is1_2;
  int is2_1;
  int is1_1;
  int is2;
  int is1;
  int is;
  TPZStack<int,_10> *in_stack_fffffffffffffd48;
  double *in_stack_fffffffffffffd50;
  undefined8 in_stack_fffffffffffffd58;
  TPZStack<int,_10> *in_stack_fffffffffffffd60;
  double in_stack_fffffffffffffd68;
  TPZFMatrix<double> *in_stack_fffffffffffffd70;
  int local_274;
  int local_270;
  int local_90;
  TPZVec<int> local_80 [2];
  undefined4 local_34;
  undefined4 local_30;
  int local_2c;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  
  for (local_1c = 8; local_1c < 0x14; local_1c = local_1c + 1) {
    local_20 = pztopology::TPZCube::ContainedSideLocId
                         ((int)in_stack_fffffffffffffd60,
                          (int)((ulong)in_stack_fffffffffffffd58 >> 0x20));
    local_24 = pztopology::TPZCube::ContainedSideLocId
                         ((int)in_stack_fffffffffffffd60,
                          (int)((ulong)in_stack_fffffffffffffd58 >> 0x20));
    pdVar5 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffd70,(int64_t)in_stack_fffffffffffffd68,
                        (int64_t)in_stack_fffffffffffffd60);
    dVar7 = *pdVar5;
    pdVar5 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffd70,(int64_t)in_stack_fffffffffffffd68,
                        (int64_t)in_stack_fffffffffffffd60);
    dVar1 = *pdVar5;
    pdVar5 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffd70,(int64_t)in_stack_fffffffffffffd68,
                        (int64_t)in_stack_fffffffffffffd60);
    *pdVar5 = dVar7 * dVar1;
    pdVar5 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffd70,(int64_t)in_stack_fffffffffffffd68,
                        (int64_t)in_stack_fffffffffffffd60);
    dVar7 = *pdVar5;
    pdVar5 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffd70,(int64_t)in_stack_fffffffffffffd68,
                        (int64_t)in_stack_fffffffffffffd60);
    dVar1 = *pdVar5;
    pdVar5 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffd70,(int64_t)in_stack_fffffffffffffd68,
                        (int64_t)in_stack_fffffffffffffd60);
    dVar2 = *pdVar5;
    pdVar5 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffd70,(int64_t)in_stack_fffffffffffffd68,
                        (int64_t)in_stack_fffffffffffffd60);
    dVar3 = *pdVar5;
    pdVar5 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffd70,(int64_t)in_stack_fffffffffffffd68,
                        (int64_t)in_stack_fffffffffffffd60);
    *pdVar5 = dVar7 * dVar1 + dVar2 * dVar3;
    pdVar5 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffd70,(int64_t)in_stack_fffffffffffffd68,
                        (int64_t)in_stack_fffffffffffffd60);
    dVar7 = *pdVar5;
    pdVar5 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffd70,(int64_t)in_stack_fffffffffffffd68,
                        (int64_t)in_stack_fffffffffffffd60);
    dVar1 = *pdVar5;
    pdVar5 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffd70,(int64_t)in_stack_fffffffffffffd68,
                        (int64_t)in_stack_fffffffffffffd60);
    dVar2 = *pdVar5;
    pdVar5 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffd70,(int64_t)in_stack_fffffffffffffd68,
                        (int64_t)in_stack_fffffffffffffd60);
    dVar3 = *pdVar5;
    pdVar5 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffd70,(int64_t)in_stack_fffffffffffffd68,
                        (int64_t)in_stack_fffffffffffffd60);
    *pdVar5 = dVar7 * dVar1 + dVar2 * dVar3;
    pdVar5 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffd70,(int64_t)in_stack_fffffffffffffd68,
                        (int64_t)in_stack_fffffffffffffd60);
    dVar7 = *pdVar5;
    pdVar5 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffd70,(int64_t)in_stack_fffffffffffffd68,
                        (int64_t)in_stack_fffffffffffffd60);
    dVar1 = *pdVar5;
    pdVar5 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffd70,(int64_t)in_stack_fffffffffffffd68,
                        (int64_t)in_stack_fffffffffffffd60);
    dVar2 = *pdVar5;
    pdVar5 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffd70,(int64_t)in_stack_fffffffffffffd68,
                        (int64_t)in_stack_fffffffffffffd60);
    dVar3 = *pdVar5;
    pdVar5 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffd70,(int64_t)in_stack_fffffffffffffd68,
                        (int64_t)in_stack_fffffffffffffd60);
    *pdVar5 = dVar7 * dVar1 + dVar2 * dVar3;
  }
  for (local_1c = 0x14; local_1c < 0x1a; local_1c = local_1c + 1) {
    local_28 = pztopology::TPZCube::ContainedSideLocId
                         ((int)in_stack_fffffffffffffd60,
                          (int)((ulong)in_stack_fffffffffffffd58 >> 0x20));
    local_2c = pztopology::TPZCube::ContainedSideLocId
                         ((int)in_stack_fffffffffffffd60,
                          (int)((ulong)in_stack_fffffffffffffd58 >> 0x20));
    pdVar5 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffd70,(int64_t)in_stack_fffffffffffffd68,
                        (int64_t)in_stack_fffffffffffffd60);
    dVar7 = *pdVar5;
    pdVar5 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffd70,(int64_t)in_stack_fffffffffffffd68,
                        (int64_t)in_stack_fffffffffffffd60);
    dVar1 = *pdVar5;
    pdVar5 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffd70,(int64_t)in_stack_fffffffffffffd68,
                        (int64_t)in_stack_fffffffffffffd60);
    *pdVar5 = dVar7 * dVar1;
    pdVar5 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffd70,(int64_t)in_stack_fffffffffffffd68,
                        (int64_t)in_stack_fffffffffffffd60);
    dVar7 = *pdVar5;
    pdVar5 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffd70,(int64_t)in_stack_fffffffffffffd68,
                        (int64_t)in_stack_fffffffffffffd60);
    dVar1 = *pdVar5;
    pdVar5 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffd70,(int64_t)in_stack_fffffffffffffd68,
                        (int64_t)in_stack_fffffffffffffd60);
    dVar2 = *pdVar5;
    pdVar5 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffd70,(int64_t)in_stack_fffffffffffffd68,
                        (int64_t)in_stack_fffffffffffffd60);
    dVar3 = *pdVar5;
    pdVar5 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffd70,(int64_t)in_stack_fffffffffffffd68,
                        (int64_t)in_stack_fffffffffffffd60);
    *pdVar5 = dVar7 * dVar1 + dVar2 * dVar3;
    pdVar5 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffd70,(int64_t)in_stack_fffffffffffffd68,
                        (int64_t)in_stack_fffffffffffffd60);
    dVar7 = *pdVar5;
    pdVar5 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffd70,(int64_t)in_stack_fffffffffffffd68,
                        (int64_t)in_stack_fffffffffffffd60);
    dVar1 = *pdVar5;
    pdVar5 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffd70,(int64_t)in_stack_fffffffffffffd68,
                        (int64_t)in_stack_fffffffffffffd60);
    dVar2 = *pdVar5;
    pdVar5 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffd70,(int64_t)in_stack_fffffffffffffd68,
                        (int64_t)in_stack_fffffffffffffd60);
    dVar3 = *pdVar5;
    pdVar5 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffd70,(int64_t)in_stack_fffffffffffffd68,
                        (int64_t)in_stack_fffffffffffffd60);
    *pdVar5 = dVar7 * dVar1 + dVar2 * dVar3;
    pdVar5 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffd70,(int64_t)in_stack_fffffffffffffd68,
                        (int64_t)in_stack_fffffffffffffd60);
    dVar7 = *pdVar5;
    pdVar5 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffd70,(int64_t)in_stack_fffffffffffffd68,
                        (int64_t)in_stack_fffffffffffffd60);
    dVar1 = *pdVar5;
    pdVar5 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffd70,(int64_t)in_stack_fffffffffffffd68,
                        (int64_t)in_stack_fffffffffffffd60);
    dVar2 = *pdVar5;
    pdVar5 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffd70,(int64_t)in_stack_fffffffffffffd68,
                        (int64_t)in_stack_fffffffffffffd60);
    dVar3 = *pdVar5;
    pdVar5 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffd70,(int64_t)in_stack_fffffffffffffd68,
                        (int64_t)in_stack_fffffffffffffd60);
    *pdVar5 = dVar7 * dVar1 + dVar2 * dVar3;
  }
  for (local_1c = 0x1a; local_1c < 0x1b; local_1c = local_1c + 1) {
    local_30 = 0;
    local_34 = 6;
    pdVar5 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffd70,(int64_t)in_stack_fffffffffffffd68,
                        (int64_t)in_stack_fffffffffffffd60);
    dVar7 = *pdVar5;
    pdVar5 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffd70,(int64_t)in_stack_fffffffffffffd68,
                        (int64_t)in_stack_fffffffffffffd60);
    dVar1 = *pdVar5;
    pdVar5 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffd70,(int64_t)in_stack_fffffffffffffd68,
                        (int64_t)in_stack_fffffffffffffd60);
    *pdVar5 = dVar7 * dVar1;
    pdVar5 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffd70,(int64_t)in_stack_fffffffffffffd68,
                        (int64_t)in_stack_fffffffffffffd60);
    dVar7 = *pdVar5;
    pdVar5 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffd70,(int64_t)in_stack_fffffffffffffd68,
                        (int64_t)in_stack_fffffffffffffd60);
    dVar1 = *pdVar5;
    pdVar5 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffd70,(int64_t)in_stack_fffffffffffffd68,
                        (int64_t)in_stack_fffffffffffffd60);
    dVar2 = *pdVar5;
    pdVar5 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffd70,(int64_t)in_stack_fffffffffffffd68,
                        (int64_t)in_stack_fffffffffffffd60);
    dVar3 = *pdVar5;
    pdVar5 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffd70,(int64_t)in_stack_fffffffffffffd68,
                        (int64_t)in_stack_fffffffffffffd60);
    *pdVar5 = dVar7 * dVar1 + dVar2 * dVar3;
    pdVar5 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffd70,(int64_t)in_stack_fffffffffffffd68,
                        (int64_t)in_stack_fffffffffffffd60);
    dVar7 = *pdVar5;
    pdVar5 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffd70,(int64_t)in_stack_fffffffffffffd68,
                        (int64_t)in_stack_fffffffffffffd60);
    dVar1 = *pdVar5;
    pdVar5 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffd70,(int64_t)in_stack_fffffffffffffd68,
                        (int64_t)in_stack_fffffffffffffd60);
    dVar2 = *pdVar5;
    pdVar5 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffd70,(int64_t)in_stack_fffffffffffffd68,
                        (int64_t)in_stack_fffffffffffffd60);
    dVar3 = *pdVar5;
    pdVar5 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffd70,(int64_t)in_stack_fffffffffffffd68,
                        (int64_t)in_stack_fffffffffffffd60);
    *pdVar5 = dVar7 * dVar1 + dVar2 * dVar3;
    pdVar5 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffd70,(int64_t)in_stack_fffffffffffffd68,
                        (int64_t)in_stack_fffffffffffffd60);
    dVar7 = *pdVar5;
    pdVar5 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffd70,(int64_t)in_stack_fffffffffffffd68,
                        (int64_t)in_stack_fffffffffffffd60);
    dVar1 = *pdVar5;
    pdVar5 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffd70,(int64_t)in_stack_fffffffffffffd68,
                        (int64_t)in_stack_fffffffffffffd60);
    dVar2 = *pdVar5;
    pdVar5 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffd70,(int64_t)in_stack_fffffffffffffd68,
                        (int64_t)in_stack_fffffffffffffd60);
    dVar3 = *pdVar5;
    pdVar5 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffd70,(int64_t)in_stack_fffffffffffffd68,
                        (int64_t)in_stack_fffffffffffffd60);
    *pdVar5 = dVar7 * dVar1 + dVar2 * dVar3;
  }
  for (local_1c = 8; iVar4 = (int)((ulong)in_stack_fffffffffffffd50 >> 0x20), local_1c < 0x1b;
      local_1c = local_1c + 1) {
    TPZStack<int,_10>::TPZStack(in_stack_fffffffffffffd60);
    pztopology::TPZCube::HigherDimensionSides(iVar4,in_stack_fffffffffffffd48);
    iVar6 = TPZVec<int>::NElements(local_80);
    for (local_90 = 0; local_90 < (int)iVar6; local_90 = local_90 + 1) {
      TPZVec<int>::operator[](local_80,(long)local_90);
      pdVar5 = TPZFMatrix<double>::operator()
                         (in_stack_fffffffffffffd70,(int64_t)in_stack_fffffffffffffd68,
                          (int64_t)in_stack_fffffffffffffd60);
      dVar7 = *pdVar5;
      pdVar5 = TPZFMatrix<double>::operator()
                         (in_stack_fffffffffffffd70,(int64_t)in_stack_fffffffffffffd68,
                          (int64_t)in_stack_fffffffffffffd60);
      *pdVar5 = *pdVar5 + dVar7;
      pdVar5 = TPZFMatrix<double>::operator()
                         (in_stack_fffffffffffffd70,(int64_t)in_stack_fffffffffffffd68,
                          (int64_t)in_stack_fffffffffffffd60);
      dVar7 = *pdVar5;
      pdVar5 = TPZFMatrix<double>::operator()
                         (in_stack_fffffffffffffd70,(int64_t)in_stack_fffffffffffffd68,
                          (int64_t)in_stack_fffffffffffffd60);
      *pdVar5 = *pdVar5 + dVar7;
      pdVar5 = TPZFMatrix<double>::operator()
                         (in_stack_fffffffffffffd70,(int64_t)in_stack_fffffffffffffd68,
                          (int64_t)in_stack_fffffffffffffd60);
      dVar7 = *pdVar5;
      pdVar5 = TPZFMatrix<double>::operator()
                         (in_stack_fffffffffffffd70,(int64_t)in_stack_fffffffffffffd68,
                          (int64_t)in_stack_fffffffffffffd60);
      *pdVar5 = *pdVar5 + dVar7;
      pdVar5 = TPZFMatrix<double>::operator()
                         (in_stack_fffffffffffffd70,(int64_t)in_stack_fffffffffffffd68,
                          (int64_t)in_stack_fffffffffffffd60);
      dVar7 = *pdVar5;
      pdVar5 = TPZFMatrix<double>::operator()
                         (in_stack_fffffffffffffd70,(int64_t)in_stack_fffffffffffffd68,
                          (int64_t)in_stack_fffffffffffffd60);
      *pdVar5 = dVar7 + *pdVar5;
    }
    iVar4 = pztopology::TPZCube::SideDimension(0x1874235);
    if (iVar4 == 1) {
      local_270 = 4;
    }
    else {
      if (iVar4 == 2) {
        local_274 = 0x10;
      }
      else {
        local_274 = 0;
        if (iVar4 == 3) {
          local_274 = 0x40;
        }
      }
      local_270 = local_274;
    }
    pdVar5 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffd70,(int64_t)in_stack_fffffffffffffd68,
                        (int64_t)in_stack_fffffffffffffd60);
    *pdVar5 = *pdVar5 * (double)local_270;
    in_stack_fffffffffffffd68 = (double)local_270;
    in_stack_fffffffffffffd70 =
         (TPZFMatrix<double> *)
         TPZFMatrix<double>::operator()
                   (in_stack_fffffffffffffd70,(int64_t)in_stack_fffffffffffffd68,
                    (int64_t)in_stack_fffffffffffffd60);
    (in_stack_fffffffffffffd70->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable.
    _vptr_TPZSavable =
         (_func_int **)
         ((double)(in_stack_fffffffffffffd70->super_TPZMatrix<double>).super_TPZBaseMatrix.
                  super_TPZSavable._vptr_TPZSavable * in_stack_fffffffffffffd68);
    dVar7 = (double)local_270;
    in_stack_fffffffffffffd60 =
         (TPZStack<int,_10> *)
         TPZFMatrix<double>::operator()
                   (in_stack_fffffffffffffd70,(int64_t)in_stack_fffffffffffffd68,
                    (int64_t)in_stack_fffffffffffffd60);
    (in_stack_fffffffffffffd60->super_TPZManVector<int,_10>).super_TPZVec<int>._vptr_TPZVec =
         (_func_int **)
         ((double)(in_stack_fffffffffffffd60->super_TPZManVector<int,_10>).super_TPZVec<int>.
                  _vptr_TPZVec * dVar7);
    in_stack_fffffffffffffd48 = (TPZStack<int,_10> *)(double)local_270;
    in_stack_fffffffffffffd50 =
         TPZFMatrix<double>::operator()
                   (in_stack_fffffffffffffd70,(int64_t)in_stack_fffffffffffffd68,
                    (int64_t)in_stack_fffffffffffffd60);
    *in_stack_fffffffffffffd50 = (double)in_stack_fffffffffffffd48 * *in_stack_fffffffffffffd50;
    TPZStack<int,_10>::~TPZStack((TPZStack<int,_10> *)0x18743bc);
  }
  return;
}

Assistant:

void TPZShapeCube::ShapeGenerating(const TPZVec<REAL> &pt, TPZFMatrix<REAL> &phi, TPZFMatrix<REAL> &dphi)
	{
		int is;
		// contribute the ribs
		for(is=8; is<20; is++)
		{
			int is1,is2;
			is1 = ContainedSideLocId(is,0);
			is2 = ContainedSideLocId(is,1);
			phi(is,0) = phi(is1,0)*phi(is2,0);
			dphi(0,is) = dphi(0,is1)*phi(is2,0)+phi(is1,0)*dphi(0,is2);
			dphi(1,is) = dphi(1,is1)*phi(is2,0)+phi(is1,0)*dphi(1,is2);
			dphi(2,is) = dphi(2,is1)*phi(is2,0)+phi(is1,0)*dphi(2,is2);
		}
		// contribution of the faces
		for(is=20; is<26; is++)
		{
			int is1,is2;
			is1 = ContainedSideLocId(is,0);
			is2 = ContainedSideLocId(is,2);
			phi(is,0) = phi(is1,0)*phi(is2,0);
			dphi(0,is) = dphi(0,is1)*phi(is2,0)+phi(is1,0)*dphi(0,is2);
			dphi(1,is) = dphi(1,is1)*phi(is2,0)+phi(is1,0)*dphi(1,is2);
			dphi(2,is) = dphi(2,is1)*phi(is2,0)+phi(is1,0)*dphi(2,is2);
		}
		// contribution of the volume
		for(is=26; is<27; is++)
		{
			int is1,is2;
			is1 = 0;
			is2 = 6;
			phi(is,0) = phi(is1,0)*phi(is2,0);
			dphi(0,is) = dphi(0,is1)*phi(is2,0)+phi(is1,0)*dphi(0,is2);
			dphi(1,is) = dphi(1,is1)*phi(is2,0)+phi(is1,0)*dphi(1,is2);
			dphi(2,is) = dphi(2,is1)*phi(is2,0)+phi(is1,0)*dphi(2,is2);
		}

		// Make the generating shape functions linear and unitary
		for(is=8; is<27; is++)
		{
			TPZStack<int> highsides;
			HigherDimensionSides(is,highsides);
			int h, nh = highsides.NElements();
			for(h=0; h<nh; h++)
			{
				int hs = highsides[h];
				phi(is,0) += phi(hs,0);
				dphi(0,is) += dphi(0,hs);
				dphi(1,is) += dphi(1,hs);
				dphi(2,is) += dphi(2,hs);
			}
			int dim = SideDimension(is);
			int mult = (dim == 1) ? 4 : (dim == 2) ? 16 : (dim ==3) ? 64 : 0;
			phi(is,0) *= mult;
			dphi(0,is) *= mult;
			dphi(1,is) *= mult;
			dphi(2,is) *= mult;
		}

	}